

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerUnion.h
# Opt level: O0

int __thiscall
llvm::
PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>
::is<std::vector<unsigned_short,std::allocator<unsigned_short>>*>
          (PointerUnion<std::vector<unsigned_char,std::allocator<unsigned_char>>*,std::vector<unsigned_short,std::allocator<unsigned_short>>*>
           *this)

{
  bool bVar1;
  int TyNo;
  PointerUnion<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>
  *this_local;
  
  bVar1 = PointerIntPair<void_*,_1U,_bool,_llvm::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>,_llvm::PointerIntPairInfo<void_*,_1U,_llvm::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>_>_>
          ::getInt((PointerIntPair<void_*,_1U,_bool,_llvm::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>,_llvm::PointerIntPairInfo<void_*,_1U,_llvm::PointerUnionUIntTraits<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_*>_>_>
                    *)this);
  return (int)bVar1;
}

Assistant:

int is() const {
    using Ty = typename ::llvm::PointerUnionTypeSelector<
        PT1, T, IsPT1,
        ::llvm::PointerUnionTypeSelector<PT2, T, IsPT2,
                                         UNION_DOESNT_CONTAIN_TYPE<T>>>::Return;
    int TyNo = Ty::Num;
    return static_cast<int>(Val.getInt()) == TyNo;
  }